

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O0

bool __thiscall
index::equal_word(index *this,wstring *word,wstring *content,size_t begin,size_t size)

{
  __type _Var1;
  ulong in_RDX;
  wstring local_48 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffffc8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffffd0;
  
  std::__cxx11::wstring::substr((ulong)local_48,in_RDX);
  _Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::wstring::~wstring(local_48);
  return _Var1;
}

Assistant:

bool index::equal_word(const std::wstring& word, const std::wstring& content, std::size_t begin, std::size_t size)
{
    return word == content.substr(begin, size);
}